

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unit_test_helper.cpp
# Opt level: O1

Image * Unit_Test::randomImage
                  (Image *__return_storage_ptr__,
                  vector<unsigned_char,_std::allocator<unsigned_char>_> *value)

{
  pointer puVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  ulong uVar5;
  uchar *puVar6;
  ulong uVar7;
  uchar *puVar8;
  ulong uVar9;
  ulong uVar10;
  
  if ((value->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
      super__Vector_impl_data._M_start ==
      (value->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
      super__Vector_impl_data._M_finish) {
    randomImage(__return_storage_ptr__,0,0);
  }
  else {
    uVar2 = rand();
    uVar3 = rand();
    PenguinV_Image::ImageTemplate<unsigned_char>::ImageTemplate
              (__return_storage_ptr__,(uVar2 & 0x7ff) + (uint)((uVar2 & 0x7ff) == 0),
               (uVar3 & 0x7ff) + (uint)((uVar3 & 0x7ff) == 0),'\x01','\x01');
    uVar2 = __return_storage_ptr__->_width;
    uVar5 = (ulong)uVar2;
    uVar3 = __return_storage_ptr__->_height;
    uVar7 = (long)(value->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl
                  .super__Vector_impl_data._M_finish -
            (long)(value->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl
                  .super__Vector_impl_data._M_start;
    if (((uVar7 <= uVar5) && ((int)(uVar5 % (uVar7 & 0xffffffff)) == 0)) &&
       (__return_storage_ptr__->_rowSize == uVar2)) {
      uVar4 = 1;
      if (uVar2 < (uint)(0xffffffff / (ulong)uVar3)) {
        uVar4 = uVar3;
        uVar3 = 1;
      }
      uVar5 = (ulong)(uVar4 * uVar2);
    }
    uVar2 = __return_storage_ptr__->_rowSize;
    uVar3 = uVar3 * uVar2;
    if (uVar3 != 0) {
      puVar6 = __return_storage_ptr__->_data;
      puVar8 = puVar6 + uVar3;
      uVar9 = 0;
      do {
        if ((int)uVar5 != 0) {
          uVar10 = 0;
          do {
            puVar1 = (value->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                     _M_impl.super__Vector_impl_data._M_start + uVar9;
            uVar9 = uVar9 + 1;
            puVar6[uVar10] = *puVar1;
            if (uVar9 == uVar7) {
              uVar9 = 0;
            }
            uVar10 = uVar10 + 1;
          } while (uVar5 != uVar10);
        }
        puVar6 = puVar6 + uVar2;
      } while (puVar6 != puVar8);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

PenguinV_Image::Image randomImage( const std::vector <uint8_t> & value )
    {
        if( value.empty() )
            return randomImage();

        PenguinV_Image::Image image( randomSize(), randomSize() );

        uint32_t height = image.height();
        uint32_t width = image.width();

        const size_t valueSize = value.size();

        if ( valueSize <= width && (width % static_cast<uint32_t>(valueSize)) == 0 )
            Image_Function::OptimiseRoi( width, height, image );

        const uint32_t rowSize  = image.rowSize();
        uint8_t * outY          = image.data();
        const uint8_t * outYEnd = outY + height * rowSize;

        size_t id = 0;

        for ( ; outY != outYEnd; outY += rowSize ) {
            uint8_t * outX = outY;
            const uint8_t * outXEnd = outX + width;

            for( ; outX != outXEnd; ++outX ) {
                (*outX) = value[id++];
                if ( id == valueSize )
                    id = 0u;
            }
        }

        return image;
    }